

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O0

int USHAReset(USHAContext *ctx,SHAversion whichSha)

{
  SHAversion whichSha_local;
  USHAContext *ctx_local;
  
  if (ctx == (USHAContext *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    ctx->whichSha = whichSha;
    switch(whichSha) {
    case SHA1:
      ctx_local._4_4_ = SHA1Reset(&(ctx->ctx).sha1Context);
      break;
    case SHA224:
      ctx_local._4_4_ = SHA224Reset(&(ctx->ctx).sha224Context);
      break;
    case SHA256:
      ctx_local._4_4_ = SHA256Reset(&(ctx->ctx).sha256Context);
      break;
    case SHA384:
      ctx_local._4_4_ = SHA384Reset(&(ctx->ctx).sha384Context);
      break;
    case SHA512:
      ctx_local._4_4_ = SHA512Reset(&(ctx->ctx).sha512Context);
      break;
    default:
      ctx_local._4_4_ = 4;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int USHAReset(USHAContext *ctx, enum SHAversion whichSha)
{
    if (ctx) {
        ctx->whichSha = whichSha;
        switch (whichSha) {
        case SHA1:   return SHA1Reset((SHA1Context*)&ctx->ctx);
        case SHA224: return SHA224Reset((SHA224Context*)&ctx->ctx);
        case SHA256: return SHA256Reset((SHA256Context*)&ctx->ctx);
        case SHA384: return SHA384Reset((SHA384Context*)&ctx->ctx);
        case SHA512: return SHA512Reset((SHA512Context*)&ctx->ctx);
        default: return shaBadParam;
        }
    }
    else {
        return shaNull;
    }
}